

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mesh.cpp
# Opt level: O0

void __thiscall
Omega_h::Mesh::set_tag<long>(Mesh *this,Int ent_dim,string *name,Read<long> *array,bool internal)

{
  LO b;
  int ncomps;
  ulong uVar1;
  Read<long> local_60;
  byte local_49;
  Read<long> *pRStack_48;
  bool internal_local;
  Read<long> *array_local;
  string *name_local;
  Mesh *pMStack_30;
  Int ent_dim_local;
  Mesh *this_local;
  Read<long> *local_20;
  Read<long> *local_18;
  ulong local_10;
  
  if (((ulong)(array->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((array->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(array->write_).shared_alloc_.alloc >> 3;
  }
  uVar1 = local_10 >> 3;
  local_49 = internal;
  pRStack_48 = array;
  array_local = (Read<long> *)name;
  name_local._4_4_ = ent_dim;
  pMStack_30 = this;
  this_local = (Mesh *)array;
  local_20 = array;
  local_18 = array;
  b = nents(this,ent_dim);
  ncomps = divide_no_remainder<int>((int)uVar1,b);
  Read<long>::Read(&local_60,(Read<int> *)array);
  add_tag<long>(this,ent_dim,name,ncomps,&local_60,(bool)(local_49 & 1));
  Read<long>::~Read(&local_60);
  return;
}

Assistant:

void Mesh::set_tag(
    Int ent_dim, std::string const& name, Read<T> array, bool internal) {
  this->add_tag(ent_dim, name, divide_no_remainder(array.size(), nents(ent_dim)), array, internal);
}